

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_websocket.c
# Opt level: O2

void test_receive_ping_frame_payload_too_long(void)

{
  anon_struct_4_7_799a2f31_for_ws_flags *paVar1;
  cio_websocket *websocket;
  _Bool _Var2;
  cio_error cVar3;
  undefined1 status_code_required;
  ws_frame local_c8;
  undefined4 local_a8;
  undefined8 local_a4;
  undefined8 uStack_9c;
  undefined4 local_94;
  undefined2 local_90;
  char data [126];
  
  local_c8.data = data;
  data[8] = '\0';
  data[9] = '\0';
  data[10] = '\0';
  data[0xb] = '\0';
  data[0xc] = '\0';
  data[0xd] = '\0';
  data[0xe] = '\0';
  data[0xf] = '\0';
  data[0x70] = '\0';
  data[0x71] = '\0';
  data[0x72] = '\0';
  data[0x73] = '\0';
  data[0x74] = '\0';
  data[0x75] = '\0';
  data[0x76] = '\0';
  data[0x77] = '\0';
  data[0x78] = '\0';
  data[0x79] = '\0';
  data[0x7a] = '\0';
  data[0x7b] = '\0';
  data[0x7c] = '\0';
  data[0x7d] = '\0';
  data[0x60] = '\0';
  data[0x61] = '\0';
  data[0x62] = '\0';
  data[99] = '\0';
  data[100] = '\0';
  data[0x65] = '\0';
  data[0x66] = '\0';
  data[0x67] = '\0';
  data[0x68] = '\0';
  data[0x69] = '\0';
  data[0x6a] = '\0';
  data[0x6b] = '\0';
  data[0x6c] = '\0';
  data[0x6d] = '\0';
  data[0x6e] = '\0';
  data[0x6f] = '\0';
  data[0x50] = '\0';
  data[0x51] = '\0';
  data[0x52] = '\0';
  data[0x53] = '\0';
  data[0x54] = '\0';
  data[0x55] = '\0';
  data[0x56] = '\0';
  data[0x57] = '\0';
  data[0x58] = '\0';
  data[0x59] = '\0';
  data[0x5a] = '\0';
  data[0x5b] = '\0';
  data[0x5c] = '\0';
  data[0x5d] = '\0';
  data[0x5e] = '\0';
  data[0x5f] = '\0';
  data[0x40] = '\0';
  data[0x41] = '\0';
  data[0x42] = '\0';
  data[0x43] = '\0';
  data[0x44] = '\0';
  data[0x45] = '\0';
  data[0x46] = '\0';
  data[0x47] = '\0';
  data[0x48] = '\0';
  data[0x49] = '\0';
  data[0x4a] = '\0';
  data[0x4b] = '\0';
  data[0x4c] = '\0';
  data[0x4d] = '\0';
  data[0x4e] = '\0';
  data[0x4f] = '\0';
  data[0x30] = '\0';
  data[0x31] = '\0';
  data[0x32] = '\0';
  data[0x33] = '\0';
  data[0x34] = '\0';
  data[0x35] = '\0';
  data[0x36] = '\0';
  data[0x37] = '\0';
  data[0x38] = '\0';
  data[0x39] = '\0';
  data[0x3a] = '\0';
  data[0x3b] = '\0';
  data[0x3c] = '\0';
  data[0x3d] = '\0';
  data[0x3e] = '\0';
  data[0x3f] = '\0';
  data[0x20] = '\0';
  data[0x21] = '\0';
  data[0x22] = '\0';
  data[0x23] = '\0';
  data[0x24] = '\0';
  data[0x25] = '\0';
  data[0x26] = '\0';
  data[0x27] = '\0';
  data[0x28] = '\0';
  data[0x29] = '\0';
  data[0x2a] = '\0';
  data[0x2b] = '\0';
  data[0x2c] = '\0';
  data[0x2d] = '\0';
  data[0x2e] = '\0';
  data[0x2f] = '\0';
  data[0x10] = '\0';
  data[0x11] = '\0';
  data[0x12] = '\0';
  data[0x13] = '\0';
  data[0x14] = '\0';
  data[0x15] = '\0';
  data[0x16] = '\0';
  data[0x17] = '\0';
  data[0x18] = '\0';
  data[0x19] = '\0';
  data[0x1a] = '\0';
  data[0x1b] = '\0';
  data[0x1c] = '\0';
  data[0x1d] = '\0';
  data[0x1e] = '\0';
  data[0x1f] = '\0';
  data[0] = 'a';
  data[1] = '\0';
  data[2] = '\0';
  data[3] = '\0';
  data[4] = '\0';
  data[5] = '\0';
  data[6] = '\0';
  data[7] = '\0';
  local_c8.frame_type = CIO_WEBSOCKET_PING_FRAME;
  local_c8.direction = FROM_CLIENT;
  local_c8.data_length = 0x7e;
  local_c8.last_frame = true;
  local_c8.rsv = false;
  local_a8 = 8;
  local_a4 = 0;
  uStack_9c = 0;
  local_94 = 0;
  local_90 = 1;
  serialize_frames(&local_c8,2);
  websocket = ws;
  paVar1 = &(ws->ws_private).ws_flags;
  *(ushort *)paVar1 = *(ushort *)paVar1 | 0x400;
  cVar3 = cio_websocket_read_message(websocket,read_handler,(void *)0x0);
  UnityAssertEqualNumber
            (0,(long)cVar3,"Could not start reading a message!",0x587,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (0,(ulong)on_control_fake.call_count,"control callback was called",0x589,
             UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (1,(ulong)read_handler_fake.call_count,"read_handler was not called",0x58b,
             UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            ((UNITY_INT)ws,(UNITY_INT)read_handler_fake.arg0_val,
             "websocket parameter of read_handler not correct",0x58c,UNITY_DISPLAY_STYLE_HEX64);
  if (read_handler_fake.arg1_val != (void *)0x0) {
    UnityFail("context parameter of read_handler not correct",0x58d);
  }
  UnityAssertEqualNumber
            (1,(long)read_handler_fake.arg2_val,"error parameter of read_handler not correct",0x58e,
             UNITY_DISPLAY_STYLE_INT);
  if (read_handler_fake.arg4_val == (uint8_t *)0x0) {
    UnityAssertEqualNumber
              (0,read_handler_fake.arg5_val,"length parameter of read_handler not correct",0x590,
               UNITY_DISPLAY_STYLE_INT);
    UnityAssertEqualNumber
              (1,(ulong)on_error_fake.call_count,"error callback was not called",0x592,
               UNITY_DISPLAY_STYLE_INT);
    UnityAssertEqualNumber
              ((UNITY_INT)ws,(UNITY_INT)on_error_fake.arg0_val,
               "ws parameter in first fragment of error callback not correct",0x593,
               UNITY_DISPLAY_STYLE_INT);
    UnityAssertEqualNumber
              (-0x5d,(long)on_error_fake.arg1_val,"error parameter in error callback not correct",
               0x594,UNITY_DISPLAY_STYLE_INT);
    status_code_required = 0x60;
    UnityAssertEqualString
              ("payload of control frame too long",(char *)read_back_buffer,
               "reason in error callback not correct",0x595);
    _Var2 = is_close_frame(0x3ea,(_Bool)status_code_required);
    if (_Var2) {
      return;
    }
    UnityFail("written frame is not a close frame!",0x596);
  }
  UnityFail("data parameter of read_handler not correct",0x58f);
}

Assistant:

static void test_receive_ping_frame_payload_too_long(void)
{
	char data[126] = {'a'};

	struct ws_frame frames[] = {
	    {.frame_type = CIO_WEBSOCKET_PING_FRAME, .direction = FROM_CLIENT, .data = data, .data_length = sizeof(data), .last_frame = true, .rsv = false},
	    {.frame_type = CIO_WEBSOCKET_CLOSE_FRAME, .direction = FROM_CLIENT, .data = NULL, .data_length = 0, .last_frame = true, .rsv = false},
	};

	serialize_frames(frames, ARRAY_SIZE(frames));

	ws->ws_private.ws_flags.is_server = (frames[0].direction == FROM_CLIENT) ? 1 : 0;
	enum cio_error err = cio_websocket_read_message(ws, read_handler, NULL);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Could not start reading a message!");

	TEST_ASSERT_EQUAL_MESSAGE(0, on_control_fake.call_count, "control callback was called");

	TEST_ASSERT_EQUAL_MESSAGE(1, read_handler_fake.call_count, "read_handler was not called");
	TEST_ASSERT_EQUAL_PTR_MESSAGE(ws, read_handler_fake.arg0_val, "websocket parameter of read_handler not correct");
	TEST_ASSERT_NULL_MESSAGE(read_handler_fake.arg1_val, "context parameter of read_handler not correct");
	TEST_ASSERT_EQUAL_MESSAGE(CIO_EOF, read_handler_fake.arg2_val, "error parameter of read_handler not correct");
	TEST_ASSERT_NULL_MESSAGE(read_handler_fake.arg4_val, "data parameter of read_handler not correct");
	TEST_ASSERT_EQUAL_MESSAGE(0, read_handler_fake.arg5_val, "length parameter of read_handler not correct");

	TEST_ASSERT_EQUAL_MESSAGE(1, on_error_fake.call_count, "error callback was not called");
	TEST_ASSERT_EQUAL_MESSAGE(ws, on_error_fake.arg0_val, "ws parameter in first fragment of error callback not correct");
	TEST_ASSERT_EQUAL_MESSAGE(CIO_PROTOCOL_NOT_SUPPORTED, on_error_fake.arg1_val, "error parameter in error callback not correct");
	TEST_ASSERT_EQUAL_STRING_MESSAGE("payload of control frame too long", read_back_buffer, "reason in error callback not correct");
	TEST_ASSERT_MESSAGE(is_close_frame(CIO_WEBSOCKET_CLOSE_PROTOCOL_ERROR, true), "written frame is not a close frame!");
}